

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O0

void UnitTest::CheckEqual<int,FIX::OrderQty>
               (TestResults *results,int *expected,OrderQty *actual,TestDetails *details)

{
  int iVar1;
  undefined8 test;
  ostream *poVar2;
  char *failure;
  double dVar3;
  undefined1 local_1c0 [8];
  MemoryOutStream stream;
  TestDetails *details_local;
  OrderQty *actual_local;
  int *expected_local;
  TestResults *results_local;
  
  iVar1 = *expected;
  stream._400_8_ = details;
  dVar3 = FIX::DoubleField::operator_cast_to_double(&actual->super_QtyField);
  if (((double)iVar1 != dVar3) || (NAN((double)iVar1) || NAN(dVar3))) {
    MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1c0);
    poVar2 = std::operator<<((ostream *)local_1c0,"Expected ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*expected);
    poVar2 = std::operator<<(poVar2," but was ");
    FIX::operator<<(poVar2,(FieldBase *)actual);
    test = stream._400_8_;
    failure = MemoryOutStream::GetText((MemoryOutStream *)local_1c0);
    TestResults::OnTestFailure(results,(TestDetails *)test,failure);
    MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1c0);
  }
  return;
}

Assistant:

void CheckEqual(TestResults& results, Expected const& expected, Actual const& actual, TestDetails const& details)
{
    if (!(expected == actual))
    {
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}